

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concave_hull.cpp
# Opt level: O2

void empty_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  empty t;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  basic_wrap_stringstream<char> local_208;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_210 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"empty");
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30 = (pbVar2->_M_dataplus)._M_p;
  local_28 = local_30 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  t.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  t.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  t.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_220 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"empty");
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40 = (pbVar2->_M_dataplus)._M_p;
  local_38 = local_40 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_230 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"empty");
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50 = (pbVar2->_M_dataplus)._M_p;
  local_48 = local_50 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  empty::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_240 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"empty");
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60 = (pbVar2->_M_dataplus)._M_p;
  local_58 = local_60 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
  ;
  local_250 = "";
  memset(&local_208,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"empty");
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70 = (pbVar2->_M_dataplus)._M_p;
  local_68 = local_70 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x22);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  std::
  _Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ::~_Vector_base((_Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
                   *)&t);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(empty, ConcaveHull)
{
    Ring hull = list_of(Point(0, 0))(Point(0, 1))(Point(1, 1))(Point(1, 0)), hull_copy(hull);
    concave_hull(input, 0, hull);
    BOOST_CHECK(equals(hull, hull_copy));
}